

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
userDefinedUnits_removeUserDefinition_Test::~userDefinedUnits_removeUserDefinition_Test
          (userDefinedUnits_removeUserDefinition_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(userDefinedUnits, removeUserDefinition)
{
    precise_unit nidgit2(3.256, cd / m.pow(2));
    addUserDefinedUnit("nidgitS", nidgit2);
    precise_unit nidgit3(3.256, cd / m.pow(3));
    addUserDefinedUnit("nidgitC", nidgit3);

    auto ipm = unit_from_string("$/nidgitS");
    EXPECT_EQ(ipm, precise::currency / nidgit2);

    auto ipm2 = unit_from_string("$/nidgitC");
    EXPECT_EQ(ipm2, precise::currency / nidgit3);

    EXPECT_EQ(to_string(precise::currency / nidgit2), "$/nidgitS");
    EXPECT_EQ(to_string(precise::mol / nidgit3), "mol/nidgitC");

    removeUserDefinedUnit("nidgitS");

    auto ipm3 = unit_from_string("$/nidgitS");
    EXPECT_FALSE(is_valid(ipm3));

    auto ipm4 = unit_from_string("mol/nidgitC");
    EXPECT_EQ(ipm4, precise::mol / nidgit3);

    EXPECT_NE(to_string(precise::currency / nidgit2), "$/nidgitS");
    EXPECT_EQ(to_string(precise::s / nidgit3), "s/nidgitC");
}